

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O3

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,triangular *this,double Ja,double Jb,double Jc,
          fvar<double,_2UL> beta)

{
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *ppVar1;
  uint uVar2;
  fvar<double,_2UL> beta_00;
  size_t i;
  long lVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  size_t i_18;
  long lVar5;
  _anonymous_namespace_ *p_Var6;
  double *pdVar7;
  size_t i_38;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *pfVar8;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> **pppVar9;
  int j_1;
  ulong uVar10;
  _anonymous_namespace_ *this_01;
  long lVar11;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> **pppVar12;
  double *pdVar13;
  size_t i_41;
  int j;
  int iVar14;
  ulong uVar15;
  unsigned_long j_9;
  ulong uVar16;
  int j_2;
  int iVar17;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *this_02;
  bool bVar18;
  double dVar19;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval;
  result_t g;
  result_t g_1;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_3;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_33;
  fvar<double,_2UL> retval_14;
  fvar<double,_2UL> retval_18;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_34;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_17;
  fvar<double,_2UL> local_1a8;
  double local_190;
  double local_188;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *ppStack_180;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *local_178;
  double local_170;
  double local_168;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *ppStack_160;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *local_158;
  fvar<double,_2UL> local_148;
  fvar<double,_2UL> local_130;
  double local_118;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *ppStack_110;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *local_108;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *local_100;
  double local_f8 [4];
  fvar<double,_2UL> local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> local_a8;
  double *local_38;
  
  local_c0 = Ja;
  local_b8 = Jb;
  local_b0 = Jc;
  if (Ja * Jb * Jc <= 0.0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Ja * Jb * Jc should be positive");
  }
  else {
    if (0.0 < beta.v._M_elems[0]) {
      (anonymous_namespace)::
      func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                (&local_a8,(_anonymous_namespace_ *)this,Ja,Jb,Jc,beta);
      local_188 = 0.0;
      ppStack_180 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)0x0;
      local_178 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)0x0;
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_148,&local_a8,0.0,0.0);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_130,&local_a8,0.0,6.283185307179586);
      lVar3 = 0;
      do {
        local_1a8.v._M_elems[lVar3] = local_148.v._M_elems[lVar3] + local_130.v._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_38 = (double *)__return_storage_ptr__;
      lVar3 = 0;
      do {
        (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      iVar14 = 0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1a8,&local_a8,0.0,
                   (double)(iVar14 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
        local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
        if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
        }
        if (local_1a8.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      iVar14 = 1;
      local_190 = 1.0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1a8,&local_a8,0.0,local_190 * 0.7853981633974483 + 0.0);
        local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] + local_1a8.v._M_elems[0];
        if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] + local_1a8.v._M_elems[1];
        }
        if (local_1a8.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] + local_1a8.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_190 = local_190 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      iVar14 = 0;
      do {
        local_190 = (double)(iVar14 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_130,&local_a8,local_190,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d8,&local_a8,local_190,6.283185307179586);
        lVar3 = 0;
        do {
          local_148.v._M_elems[lVar3] = local_130.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1a8.v._M_elems[1] = local_148.v._M_elems[1];
        local_1a8.v._M_elems[2] = local_148.v._M_elems[2];
        local_1a8.v._M_elems[0] = local_148.v._M_elems[0] * 4.0;
        if ((local_148.v._M_elems[1] != 0.0) || (NAN(local_148.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_148.v._M_elems[1] * 4.0;
        }
        if (local_148.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_148.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar17 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,local_190,
                     (double)(iVar17 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 16.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 16.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 16.0;
          }
          lVar3 = 0;
          do {
            (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          iVar17 = iVar17 + 1;
        } while (iVar17 != 8);
        iVar17 = 1;
        dVar19 = 1.0;
        do {
          local_170 = dVar19;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,local_190,dVar19 * 0.7853981633974483 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 8.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 8.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 8.0;
          }
          lVar3 = 0;
          do {
            (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          dVar19 = local_170 + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar17 != 8);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      iVar14 = 1;
      ppVar1 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)0x3ff0000000000000;
      do {
        local_190 = (double)ppVar1 * 0.7853981633974483 + 0.0;
        local_100 = ppVar1;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_130,&local_a8,local_190,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d8,&local_a8,local_190,6.283185307179586);
        lVar3 = 0;
        do {
          local_148.v._M_elems[lVar3] = local_130.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1a8.v._M_elems[1] = local_148.v._M_elems[1];
        local_1a8.v._M_elems[2] = local_148.v._M_elems[2];
        local_1a8.v._M_elems[0] = local_148.v._M_elems[0] + local_148.v._M_elems[0];
        if ((local_148.v._M_elems[1] != 0.0) || (NAN(local_148.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_148.v._M_elems[1] + local_148.v._M_elems[1];
        }
        if (local_148.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_148.v._M_elems[2] + local_148.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar17 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,local_190,
                     (double)(iVar17 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 8.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 8.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 8.0;
          }
          lVar3 = 0;
          do {
            (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          iVar17 = iVar17 + 1;
        } while (iVar17 != 8);
        iVar17 = 1;
        dVar19 = 1.0;
        do {
          local_170 = dVar19;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,local_190,dVar19 * 0.7853981633974483 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          dVar19 = local_170 + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar17 != 8);
        ppVar1 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)((double)local_100 + 1.0);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_148,&local_a8,6.283185307179586,0.0);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_130,&local_a8,6.283185307179586,6.283185307179586);
      lVar3 = 0;
      do {
        local_1a8.v._M_elems[lVar3] = local_148.v._M_elems[lVar3] + local_130.v._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      iVar14 = 0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1a8,&local_a8,6.283185307179586,
                   (double)(iVar14 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
        local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
        if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
        }
        if (local_1a8.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      iVar14 = 1;
      dVar19 = 1.0;
      this_02 = &local_a8;
      do {
        local_190 = dVar19;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1a8,this_02,6.283185307179586,dVar19 * 0.7853981633974483 + 0.0);
        local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] + local_1a8.v._M_elems[0];
        if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
          local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] + local_1a8.v._M_elems[1];
        }
        if (local_1a8.v._M_elems[2] != 0.0) {
          local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] + local_1a8.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          (&local_188)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        dVar19 = local_190 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar14 != 8);
      if (((double)ppStack_180 != 0.0) || (NAN((double)ppStack_180))) {
        ppStack_180 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)
                      ((double)ppStack_180 * 0.01713472986300236);
      }
      if ((double)local_178 != 0.0) {
        local_178 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)
                    ((double)local_178 * 0.01713472986300236);
      }
      ppStack_110 = ppStack_180;
      local_108 = local_178;
      local_118 = local_188 * 0.01713472986300236 + 0.6931471805599453;
      local_188 = local_118;
      local_100 = &retval;
      lVar3 = 2;
      lVar5 = 0;
      pdVar7 = (double *)&beta;
      do {
        if ((fvar<double,_2UL> *)((long)local_100 + lVar3 * -8) == &beta) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = 0.0;
          lVar11 = 0;
          pdVar13 = (double *)&beta;
          do {
            dVar19 = dVar19 + *pdVar13 * *(double *)((long)pdVar7 + lVar11);
            pdVar13 = pdVar13 + 1;
            lVar11 = lVar11 + -8;
          } while (lVar3 * 8 + -0x18 != lVar11);
        }
        local_148.v._M_elems[lVar5] = dVar19;
        lVar5 = lVar5 + 1;
        bVar18 = lVar3 == 0;
        lVar3 = lVar3 + -1;
        if (bVar18) {
          lVar3 = 0;
        }
        pdVar7 = pdVar7 + 1;
      } while (lVar5 != 3);
      dVar19 = (double)local_178 + (double)local_178;
      local_1a8.v._M_elems[0] = local_148.v._M_elems[0];
      local_1a8.v._M_elems[1] = local_148.v._M_elems[1];
      local_1a8.v._M_elems[2] = local_148.v._M_elems[2];
      if ((local_148.v._M_elems[1] != 0.0) || (NAN(local_148.v._M_elems[1]))) {
        local_1a8.v._M_elems[1] = dVar19 * local_148.v._M_elems[1];
      }
      if (local_148.v._M_elems[2] != 0.0) {
        local_1a8.v._M_elems[2] = dVar19 * local_148.v._M_elems[2];
      }
      local_f8[0] = (local_148.v._M_elems[0] * dVar19) / local_118;
      local_a8.c_ = local_f8[0];
      lVar3 = 1;
      p_Var6 = (_anonymous_namespace_ *)&local_108;
      do {
        dVar19 = 0.0;
        this_01 = (_anonymous_namespace_ *)&ppStack_110;
        pfVar8 = this_02;
        do {
          dVar19 = dVar19 + (double)*(promote<fvar<double,_2UL>,_fvar<double,_2UL>_> **)this_01 *
                            pfVar8->c_;
          this_01 = this_01 + 8;
          pfVar8 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)(pfVar8[-1].cshabc_.v._M_elems + 2);
        } while (this_01 != p_Var6);
        local_a8.sh2a_.v._M_elems[lVar3 + -1] = (local_1a8.v._M_elems[lVar3] - dVar19) / local_118;
        lVar3 = lVar3 + 1;
        this_02 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                   *)&this_02->sh2a_;
        p_Var6 = (_anonymous_namespace_ *)&local_100;
      } while (lVar3 != 3);
      if (0.0 <= local_f8[0]) {
        if ((local_f8[0] != 0.0) || (NAN(local_f8[0]))) {
          local_f8[2] = local_a8.sh2a_.v._M_elems[1];
          local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        }
        else {
          local_f8[0] = 0.0;
          local_f8[1] = 0.0;
          local_f8[2] = 0.0;
        }
      }
      else {
        local_f8[2] = local_a8.sh2a_.v._M_elems[1];
        local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        lVar3 = 0;
        do {
          *(ulong *)((long)local_f8 + lVar3) =
               *(ulong *)((long)local_f8 + lVar3) ^ 0x8000000000000000;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x18);
      }
      uVar15 = 0x10;
      while( true ) {
        beta_00.v._M_elems[1] = beta.v._M_elems[1];
        beta_00.v._M_elems[0] = beta.v._M_elems[0];
        beta_00.v._M_elems[2] = beta.v._M_elems[2];
        local_188 = local_118;
        ppStack_180 = ppStack_110;
        local_178 = local_108;
        (anonymous_namespace)::
        func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                  (&local_a8,this_01,local_c0,local_b8,local_b0,beta_00);
        local_168 = 0.0;
        ppStack_160 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)0x0;
        local_158 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)0x0;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_148,&local_a8,0.0,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_130,&local_a8,0.0,6.283185307179586);
        lVar3 = 0;
        do {
          local_1a8.v._M_elems[lVar3] = local_148.v._M_elems[lVar3] + local_130.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_190 = 6.283185307179586 / (double)(long)uVar15;
        uVar10 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,0.0,(double)(long)(uVar10 * 2 + 1) * local_190 * 0.5 + 0.0
                    );
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        uVar10 = 1;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,0.0,(double)(long)uVar10 * local_190 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] + local_1a8.v._M_elems[0];
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] + local_1a8.v._M_elems[1];
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] + local_1a8.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        uVar10 = 0;
        do {
          local_170 = (double)(long)(uVar10 * 2 + 1) * local_190 * 0.5 + 0.0;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_130,&local_a8,local_170,0.0);
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d8,&local_a8,local_170,6.283185307179586);
          lVar3 = 0;
          do {
            local_148.v._M_elems[lVar3] = local_130.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_1a8.v._M_elems[1] = local_148.v._M_elems[1];
          local_1a8.v._M_elems[2] = local_148.v._M_elems[2];
          local_1a8.v._M_elems[0] = local_148.v._M_elems[0] * 4.0;
          if ((local_148.v._M_elems[1] != 0.0) || (NAN(local_148.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_148.v._M_elems[1] * 4.0;
          }
          if (local_148.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_148.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar16 = 0;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1a8,&local_a8,local_170,
                       (double)(long)(uVar16 * 2 + 1) * local_190 * 0.5 + 0.0);
            local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 16.0;
            if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
              local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 16.0;
            }
            if (local_1a8.v._M_elems[2] != 0.0) {
              local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 16.0;
            }
            lVar3 = 0;
            do {
              (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
          uVar16 = 1;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1a8,&local_a8,local_170,(double)(long)uVar16 * local_190 + 0.0);
            local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 8.0;
            if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
              local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 8.0;
            }
            if (local_1a8.v._M_elems[2] != 0.0) {
              local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 8.0;
            }
            lVar3 = 0;
            do {
              (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        uVar10 = 1;
        do {
          local_170 = (double)(long)uVar10 * local_190 + 0.0;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_130,&local_a8,local_170,0.0);
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d8,&local_a8,local_170,6.283185307179586);
          lVar3 = 0;
          do {
            local_148.v._M_elems[lVar3] = local_130.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_1a8.v._M_elems[1] = local_148.v._M_elems[1];
          local_1a8.v._M_elems[2] = local_148.v._M_elems[2];
          local_1a8.v._M_elems[0] = local_148.v._M_elems[0] + local_148.v._M_elems[0];
          if ((local_148.v._M_elems[1] != 0.0) || (NAN(local_148.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_148.v._M_elems[1] + local_148.v._M_elems[1];
          }
          if (local_148.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_148.v._M_elems[2] + local_148.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar16 = 0;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1a8,&local_a8,local_170,
                       (double)(long)(uVar16 * 2 + 1) * local_190 * 0.5 + 0.0);
            local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 8.0;
            if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
              local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 8.0;
            }
            if (local_1a8.v._M_elems[2] != 0.0) {
              local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 8.0;
            }
            lVar3 = 0;
            do {
              (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
          uVar16 = 1;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1a8,&local_a8,local_170,(double)(long)uVar16 * local_190 + 0.0);
            local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
            if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
              local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
            }
            if (local_1a8.v._M_elems[2] != 0.0) {
              local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
            }
            lVar3 = 0;
            do {
              (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_148,&local_a8,6.283185307179586,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_130,&local_a8,6.283185307179586,6.283185307179586);
        lVar3 = 0;
        do {
          local_1a8.v._M_elems[lVar3] = local_148.v._M_elems[lVar3] + local_130.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        uVar10 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,6.283185307179586,
                     (double)(long)(uVar10 * 2 + 1) * local_190 * 0.5 + 0.0);
          ppVar1 = local_100;
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] * 4.0;
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] * 4.0;
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        uVar10 = 1;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1a8,&local_a8,6.283185307179586,(double)(long)uVar10 * local_190 + 0.0);
          local_1a8.v._M_elems[0] = local_1a8.v._M_elems[0] + local_1a8.v._M_elems[0];
          if ((local_1a8.v._M_elems[1] != 0.0) || (NAN(local_1a8.v._M_elems[1]))) {
            local_1a8.v._M_elems[1] = local_1a8.v._M_elems[1] + local_1a8.v._M_elems[1];
          }
          if (local_1a8.v._M_elems[2] != 0.0) {
            local_1a8.v._M_elems[2] = local_1a8.v._M_elems[2] + local_1a8.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            (&local_168)[lVar3] = local_1a8.v._M_elems[lVar3] + (&local_168)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar15);
        dVar19 = (local_190 * local_190) / 36.0;
        if (((double)ppStack_160 != 0.0) || (NAN((double)ppStack_160))) {
          ppStack_160 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)
                        (dVar19 * (double)ppStack_160);
        }
        if ((double)local_158 != 0.0) {
          local_158 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)(dVar19 * (double)local_158)
          ;
        }
        ppStack_110 = ppStack_160;
        local_108 = local_158;
        local_118 = local_168 * dVar19 + 0.6931471805599453;
        lVar3 = 2;
        lVar5 = 0;
        pdVar7 = (double *)&beta;
        do {
          if ((fvar<double,_2UL> *)((long)ppVar1 + lVar3 * -8) == &beta) {
            dVar19 = 0.0;
          }
          else {
            dVar19 = 0.0;
            lVar11 = 0;
            pdVar13 = (double *)&beta;
            do {
              dVar19 = dVar19 + *pdVar13 * *(double *)((long)pdVar7 + lVar11);
              pdVar13 = pdVar13 + 1;
              lVar11 = lVar11 + -8;
            } while (lVar3 * 8 + -0x18 != lVar11);
          }
          local_130.v._M_elems[lVar5] = dVar19;
          lVar5 = lVar5 + 1;
          bVar18 = lVar3 == 0;
          lVar3 = lVar3 + -1;
          if (bVar18) {
            lVar3 = 0;
          }
          pdVar7 = pdVar7 + 1;
        } while (lVar5 != 3);
        lVar3 = 0;
        do {
          local_d8.v._M_elems[lVar3] = (&local_118)[lVar3] - (&local_188)[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        dVar19 = local_d8.v._M_elems[2] + local_d8.v._M_elems[2];
        local_148.v._M_elems[0] = local_130.v._M_elems[0];
        local_148.v._M_elems[1] = local_130.v._M_elems[1];
        local_148.v._M_elems[2] = local_130.v._M_elems[2];
        if ((local_130.v._M_elems[1] != 0.0) || (NAN(local_130.v._M_elems[1]))) {
          local_148.v._M_elems[1] = dVar19 * local_130.v._M_elems[1];
        }
        if (local_130.v._M_elems[2] != 0.0) {
          local_148.v._M_elems[2] = dVar19 * local_130.v._M_elems[2];
        }
        local_a8.c_ = (local_130.v._M_elems[0] * dVar19) / local_118;
        local_1a8.v._M_elems[0] = local_a8.c_;
        lVar3 = 1;
        p_Var6 = (_anonymous_namespace_ *)&local_1a8;
        pppVar9 = &local_108;
        do {
          dVar19 = 0.0;
          this_01 = p_Var6;
          pppVar12 = &ppStack_110;
          do {
            dVar19 = dVar19 + (double)*pppVar12 * *(double *)this_01;
            pppVar12 = pppVar12 + 1;
            this_01 = this_01 + -8;
          } while (pppVar12 != pppVar9);
          local_1a8.v._M_elems[lVar3] = (local_148.v._M_elems[lVar3] - dVar19) / local_118;
          lVar3 = lVar3 + 1;
          p_Var6 = p_Var6 + 8;
          pppVar9 = &local_100;
        } while (lVar3 != 3);
        if (0.0 <= local_a8.c_) {
          if ((local_a8.c_ == 0.0) && (!NAN(local_a8.c_))) goto LAB_00110f0a;
          local_a8.sh2a_.v._M_elems[1] = local_1a8.v._M_elems[2];
          local_a8.sh2a_.v._M_elems[0] = local_1a8.v._M_elems[1];
        }
        else {
          local_a8.sh2a_.v._M_elems[1] = local_1a8.v._M_elems[2];
          local_a8.sh2a_.v._M_elems[0] = local_1a8.v._M_elems[1];
          lVar3 = 0;
          do {
            uVar2 = *(uint *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -4);
            *(undefined4 *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) =
                 *(undefined4 *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8);
            *(uint *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -4) = uVar2 ^ 0x80000000;
            lVar3 = lVar3 + 8;
          } while (lVar3 != 0x18);
        }
        if ((local_a8.c_ < 4.440892098500626e-16) || (local_f8[0] < local_a8.c_)) goto LAB_00110f0a;
        if (uVar15 == 0x10000) break;
        local_178 = local_158;
        local_188 = local_118;
        ppStack_180 = ppStack_160;
        local_f8[0] = local_a8.c_;
        local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        local_f8[2] = local_a8.sh2a_.v._M_elems[1];
        bVar18 = 0x8000 < uVar15;
        uVar15 = uVar15 * 2;
        if (bVar18) {
LAB_00110f0a:
          local_a8.sh2a_.v._M_elems[1] = (double)local_108;
          local_a8.c_ = local_118;
          local_a8.sh2a_.v._M_elems[0] = (double)ppStack_110;
          lVar3 = 0;
          do {
            *(ulong *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) =
                 *(ulong *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) ^ 0x8000000000000000;
            lVar3 = lVar3 + 8;
          } while (lVar3 != 0x18);
          *local_38 = local_a8.c_ / beta.v._M_elems[0];
          lVar5 = 1;
          lVar3 = 0x10;
          pdVar7 = local_38;
          do {
            dVar19 = 0.0;
            lVar11 = 8;
            pdVar13 = pdVar7;
            do {
              dVar19 = dVar19 + *(double *)((long)&beta + lVar11) * *pdVar13;
              pdVar13 = pdVar13 + -1;
              lVar11 = lVar11 + 8;
            } while (lVar3 != lVar11);
            local_38[lVar5] = (local_a8.sh2a_.v._M_elems[lVar5 + -1] - dVar19) / beta.v._M_elems[0];
            lVar5 = lVar5 + 1;
            pdVar7 = pdVar7 + 1;
            lVar3 = 0x18;
          } while (lVar5 != 3);
          return (fvar<double,_2UL> *)local_38;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: integration not converge with n = ",0x2b);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      goto LAB_00110f0a;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"beta should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Ja, T Jb, T Jc, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Ja * Jb * Jc <= 0)
    throw(std::invalid_argument("Ja * Jb * Jc should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto logZ =
      log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta), real_t(0),
                                             real_t(0), 2 * pi, 2 * pi, 8, 8);
  auto pz = logZ;
  auto pe = abs(beta * beta * logZ.derivative(2) / logZ);
  for (unsigned long n = 16; n <= max_n; n *= 2) {
    logZ = log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta),
                                                  real_t(0), real_t(0), 2 * pi,
                                                  2 * pi, n, n);
    auto pn = abs(beta * beta * (logZ - pz).derivative(2) / logZ);
    if (pn < 2 * std::numeric_limits<real_t>::epsilon() || pn > pe)
      break;
    if (n == max_n)
      std::cerr << "Warning: integration not converge with n = " << max_n
                << std::endl;
    pz = logZ;
    pe = pn;
  }
  return -logZ / beta;
}